

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O1

bool __thiscall
poplar::
compact_bonsai_trie<95U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::compare_dsp_(compact_bonsai_trie<95U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *this,uint64_t slot_id,uint64_t rhs)

{
  pointer puVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  puVar1 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (this->table_).width_;
  uVar6 = uVar4 * slot_id;
  uVar7 = (ulong)((uint)uVar6 & 0x3f);
  uVar5 = puVar1[uVar6 >> 6];
  if (uVar4 + uVar7 < 0x41) {
    uVar3 = (uint)(uVar5 >> uVar7);
  }
  else {
    bVar2 = (byte)uVar6 & 0x3f;
    uVar3 = (uint)(uVar5 >> bVar2) | (uint)(puVar1[(uVar6 >> 6) + 1] << 0x40 - bVar2);
  }
  uVar3 = uVar3 & (uint)(this->table_).mask_ & 0x1f;
  uVar5 = (ulong)uVar3;
  if (uVar3 == 0x1f) {
    if (rhs < 0x1f) {
      return false;
    }
    uVar4 = compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
                      (&this->aux_cht_,slot_id);
    if (uVar4 == 0xffffffffffffffff) {
      if (rhs < 0x9e) {
        return false;
      }
      uVar5 = standard_hash_table<80U,_poplar::hash::vigna_hasher>::get(&this->aux_map_,slot_id);
    }
    else {
      uVar5 = uVar4 + 0x1f;
    }
  }
  return uVar5 == rhs;
}

Assistant:

bool compare_dsp_(uint64_t slot_id, uint64_t rhs) const {
        uint64_t lhs = table_[slot_id] & dsp1_mask;
        if (lhs < dsp1_mask) {
            return lhs == rhs;
        }
        if (rhs < dsp1_mask) {
            return false;
        }

        lhs = aux_cht_.get(slot_id);
        if (lhs != aux_cht_type::nil) {
            return lhs + dsp1_mask == rhs;
        }
        if (rhs < dsp1_mask + dsp2_mask) {
            return false;
        }

        auto val = aux_map_.get(slot_id);
        assert(val != aux_map_type::nil);
        return val == rhs;
    }